

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O2

void __thiscall DynamicKReach::cover(DynamicKReach *this,vertex_t v)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint *puVar1;
  reference pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  uint *i_1;
  uint *puVar4;
  uint *i;
  
  this_00 = &this->degree_;
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,(ulong)v);
  *pvVar2 = 0;
  pvVar3 = Graph::successors(this->graph_,v);
  puVar1 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,(ulong)*puVar4);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,(ulong)*puVar4);
      *pvVar2 = *pvVar2 - 1;
    }
  }
  pvVar3 = Graph::predecessors(this->graph_,v);
  puVar1 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,(ulong)*puVar4);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,(ulong)*puVar4);
      *pvVar2 = *pvVar2 - 1;
    }
  }
  return;
}

Assistant:

void DynamicKReach::cover(vertex_t v) {
    degree_.at(v) = 0;
    for (const auto &i : graph_.successors(v)) {
        if (degree_.at(i) > 0) {
            --degree_.at(i);
        }
    }
    for (const auto &i : graph_.predecessors(v)) {
        if (degree_.at(i) > 0) {
            --degree_.at(i);
        }
    }
}